

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O3

bool __thiscall
cmWriteFileCommand::InitialPass
          (cmWriteFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *fileName;
  string *psVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Ios_Openmode _Var8;
  string *psVar9;
  mode_t mode;
  string dir;
  string message;
  string error;
  ofstream file;
  mode_t local_29c;
  string local_298;
  char *local_278;
  long local_270;
  char local_268;
  undefined7 uStack_267;
  string local_258;
  cmCommand *local_238;
  undefined1 local_230 [8];
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  fileName = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)psVar1 - (long)fileName) < 0x21) {
    local_230 = (undefined1  [8])&local_220;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_230,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    local_278 = &local_268;
    local_270 = 0;
    local_268 = '\0';
    psVar9 = fileName + 1;
    if (psVar9 == psVar1) {
      _Var8 = _S_out;
    }
    else {
      bVar3 = true;
      local_238 = &this->super_cmCommand;
      do {
        iVar4 = std::__cxx11::string::compare((char *)psVar9);
        if (iVar4 == 0) {
          bVar3 = false;
        }
        else {
          std::__cxx11::string::_M_append((char *)&local_278,(ulong)(psVar9->_M_dataplus)._M_p);
        }
        psVar9 = psVar9 + 1;
      } while (psVar9 != (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
      this = (cmWriteFileCommand *)local_238;
      _Var8 = _S_app;
      if (bVar3) {
        _Var8 = _S_out;
      }
    }
    bVar3 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,fileName);
    if (bVar3) {
      cmsys::SystemTools::GetFilenamePath(&local_298,fileName);
      cmsys::SystemTools::MakeDirectory(&local_298,(mode_t *)0x0);
      local_29c = 0;
      bVar3 = cmsys::SystemTools::GetPermissions((fileName->_M_dataplus)._M_p,&local_29c);
      if (bVar3) {
        bVar2 = true;
        if (-1 < (char)local_29c) {
          bVar2 = false;
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,local_29c | 0x90,false);
        }
      }
      else {
        bVar2 = false;
      }
      std::ofstream::ofstream(local_230,(fileName->_M_dataplus)._M_p,_Var8);
      bVar3 = (abStack_210[*(long *)((long)local_230 + -0x18)] & 5) == 0;
      if (bVar3) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_230,local_278,local_270);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        std::ofstream::close();
        if (!bVar2 && local_29c != 0) {
          cmsys::SystemTools::SetPermissions((fileName->_M_dataplus)._M_p,local_29c,false);
        }
      }
      else {
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_258,"Internal CMake error when trying to open file: ","");
        std::__cxx11::string::_M_append((char *)&local_258,(ulong)(fileName->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_258);
        cmCommand::SetError(&this->super_cmCommand,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
      }
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_298,"attempted to write a file: ",fileName);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar7) {
        local_220._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_220._8_8_ = plVar5[3];
        local_230 = (undefined1  [8])&local_220;
      }
      else {
        local_220._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_230 = (undefined1  [8])*plVar5;
      }
      local_228 = plVar5[1];
      *plVar5 = (long)paVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      cmCommand::SetError(&this->super_cmCommand,(string *)local_230);
      cmSystemTools::s_FatalErrorOccured = true;
      if (local_230 != (undefined1  [8])&local_220) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
    if (local_278 != &local_268) {
      operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool cmWriteFileCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  std::string const& fileName = *i;
  bool overwrite = true;
  i++;

  for (; i != args.end(); ++i) {
    if (*i == "APPEND") {
      overwrite = false;
    } else {
      message += *i;
    }
  }

  if (!this->Makefile->CanIWriteThisFile(fileName)) {
    std::string e =
      "attempted to write a file: " + fileName + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir);

  mode_t mode = 0;
  bool writable = false;

  // Set permissions to writable
  if (cmSystemTools::GetPermissions(fileName.c_str(), mode)) {
#if defined(_MSC_VER) || defined(__MINGW32__)
    writable = (mode & S_IWRITE) != 0;
    mode_t newMode = mode | S_IWRITE;
#else
    writable = mode & S_IWUSR;
    mode_t newMode = mode | S_IWUSR | S_IWGRP;
#endif
    if (!writable) {
      cmSystemTools::SetPermissions(fileName.c_str(), newMode);
    }
  }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                       overwrite ? std::ios::out : std::ios::app);
  if (!file) {
    std::string error = "Internal CMake error when trying to open file: ";
    error += fileName;
    error += " for writing.";
    this->SetError(error);
    return false;
  }
  file << message << std::endl;
  file.close();
  if (mode && !writable) {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
  }

  return true;
}